

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_string_find(jit_State *J,RecordFFData *rd)

{
  IRRef1 IVar1;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  TRef TVar5;
  TRef TVar6;
  uint uVar7;
  int iVar8;
  GCstr *s;
  GCobj *o;
  char *pcVar9;
  MSize MVar10;
  IRRef1 IVar11;
  IRRef1 IVar12;
  uint local_34;
  
  TVar2 = lj_ir_tostr(J,*J->base);
  TVar3 = lj_ir_tostr(J,J->base[1]);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44130000;
  TVar4 = lj_opt_fold(J);
  TVar5 = lj_ir_kint(J,0);
  s = argv2str(J,rd->argv);
  o = (GCobj *)argv2str(J,rd->argv + 1);
  J->needsnap = '\x01';
  if ((J->base[2] & 0x1f000000) == 0) {
    uVar7 = 1;
    TVar6 = lj_ir_kint(J,1);
  }
  else {
    TVar6 = lj_opt_narrow_toint(J,J->base[2]);
    uVar7 = argv2int(J,rd->argv + 2);
  }
  local_34 = uVar7;
  TVar6 = recff_string_start(J,s,(int32_t *)&local_34,TVar6,TVar4,TVar5);
  MVar10 = local_34;
  IVar12 = (IRRef1)TVar4;
  if (s->len < local_34) {
    (J->fold).ins.field_0.ot = 0x793;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = IVar12;
    lj_opt_fold(J);
    MVar10 = s->len;
    TVar6 = TVar4;
  }
  else {
    (J->fold).ins.field_0.ot = 0x693;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = IVar12;
    lj_opt_fold(J);
  }
  IVar1 = (IRRef1)TVar3;
  if ((J->base[2] == 0) || ((*(byte *)((long)J->base + 0xf) & 0x1e) == 0)) {
    TVar3 = lj_ir_kgc(J,o,IRT_STR);
    (J->fold).ins.field_0.ot = 0x884;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    iVar8 = lj_str_haspattern(&o->str);
    if (iVar8 != 0) {
      recff_nyi(J,rd);
      return;
    }
  }
  (J->fold).ins.field_0.ot = 0x3f05;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  IVar11 = (IRRef1)TVar6;
  (J->fold).ins.field_0.op2 = IVar11;
  TVar2 = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x3f05;
  (J->fold).ins.field_0.op1 = IVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
  TVar3 = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x2a13;
  (J->fold).ins.field_0.op1 = IVar12;
  (J->fold).ins.field_0.op2 = IVar11;
  TVar4 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = IVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44130000;
  TVar5 = lj_opt_fold(J);
  TVar3 = lj_ir_call(J,IRCALL_lj_str_find,(ulong)TVar2,(ulong)TVar3,(ulong)TVar4,(ulong)TVar5);
  TVar4 = lj_ir_kptr_(J,IR_KKPTR,(void *)0x0);
  pcVar9 = lj_str_find((char *)((long)&s[1].nextgc.gcptr32 + (ulong)MVar10),
                       (char *)&(o->gch).metatable,s->len - MVar10,(o->str).len);
  IVar12 = (IRRef1)TVar3;
  if (pcVar9 == (char *)0x0) {
    (J->fold).ins.field_0.ot = 0x885;
    (J->fold).ins.field_0.op1 = IVar12;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    *J->base = 0x7fff;
  }
  else {
    (J->fold).ins.field_0.ot = 0x985;
    (J->fold).ins.field_0.op1 = IVar12;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2a13;
    (J->fold).ins.field_0.op1 = IVar12;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = IVar11;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(J);
    TVar3 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    TVar3 = lj_opt_fold(J);
    *J->base = TVar3;
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
    TVar2 = lj_opt_fold(J);
    J->base[1] = TVar2;
    rd->nres = 2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_find(jit_State *J, RecordFFData *rd)
{
  TRef trstr = lj_ir_tostr(J, J->base[0]);
  TRef trpat = lj_ir_tostr(J, J->base[1]);
  TRef trlen = emitir(IRTI(IR_FLOAD), trstr, IRFL_STR_LEN);
  TRef tr0 = lj_ir_kint(J, 0);
  TRef trstart;
  GCstr *str = argv2str(J, &rd->argv[0]);
  GCstr *pat = argv2str(J, &rd->argv[1]);
  int32_t start;
  J->needsnap = 1;
  if (tref_isnil(J->base[2])) {
    trstart = lj_ir_kint(J, 1);
    start = 1;
  } else {
    trstart = lj_opt_narrow_toint(J, J->base[2]);
    start = argv2int(J, &rd->argv[2]);
  }
  trstart = recff_string_start(J, str, &start, trstart, trlen, tr0);
  if ((MSize)start <= str->len) {
    emitir(IRTGI(IR_ULE), trstart, trlen);
  } else {
    emitir(IRTGI(IR_UGT), trstart, trlen);
#if LJ_52
    J->base[0] = TREF_NIL;
    return;
#else
    trstart = trlen;
    start = str->len;
#endif
  }
  /* Fixed arg or no pattern matching chars? (Specialized to pattern string.) */
  if ((J->base[2] && tref_istruecond(J->base[3])) ||
      (emitir(IRTG(IR_EQ, IRT_STR), trpat, lj_ir_kstr(J, pat)),
       !lj_str_haspattern(pat))) {  /* Search for fixed string. */
    TRef trsptr = emitir(IRT(IR_STRREF, IRT_PGC), trstr, trstart);
    TRef trpptr = emitir(IRT(IR_STRREF, IRT_PGC), trpat, tr0);
    TRef trslen = emitir(IRTI(IR_SUB), trlen, trstart);
    TRef trplen = emitir(IRTI(IR_FLOAD), trpat, IRFL_STR_LEN);
    TRef tr = lj_ir_call(J, IRCALL_lj_str_find, trsptr, trpptr, trslen, trplen);
    TRef trp0 = lj_ir_kkptr(J, NULL);
    if (lj_str_find(strdata(str)+(MSize)start, strdata(pat),
		    str->len-(MSize)start, pat->len)) {
      TRef pos;
      emitir(IRTG(IR_NE, IRT_PGC), tr, trp0);
      /* Caveat: can't use STRREF trstr 0 here because that might be pointing into a wrong string due to folding. */
      pos = emitir(IRTI(IR_ADD), trstart, emitir(IRTI(IR_SUB), tr, trsptr));
      J->base[0] = emitir(IRTI(IR_ADD), pos, lj_ir_kint(J, 1));
      J->base[1] = emitir(IRTI(IR_ADD), pos, trplen);
      rd->nres = 2;
    } else {
      emitir(IRTG(IR_EQ, IRT_PGC), tr, trp0);
      J->base[0] = TREF_NIL;
    }
  } else {  /* Search for pattern. */
    recff_nyiu(J, rd);
    return;
  }
}